

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O1

int __thiscall PolledFile::Impl::poll(Impl *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  Metadata new_metadata;
  Metadata local_28;
  
  readFileMetadata(&local_28,(this->filename_)._M_dataplus._M_p);
  if (((((local_28.size != 0) && (local_28.time.tv_sec != 0)) && (local_28.time.tv_nsec != 0)) &&
      (((local_28.size != (this->metadata_).size ||
        (local_28.time.tv_sec != (this->metadata_).time.tv_sec)) ||
       (local_28.time.tv_nsec != (this->metadata_).time.tv_nsec)))) &&
     (bVar1 = readFileContents((this->filename_)._M_dataplus._M_p,&this->buffer_), bVar1)) {
    aAppDebugPrintf("Read file %s, %d bytes",(this->filename_)._M_dataplus._M_p,
                    (ulong)(uint)(*(int *)&(this->buffer_).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                 *(int *)&(this->buffer_).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
    (this->metadata_).time.tv_nsec = local_28.time.tv_nsec;
    (this->metadata_).size = local_28.size;
    (this->metadata_).time.tv_sec = local_28.time.tv_sec;
    return (int)CONCAT71((int7)((ulong)local_28.time.tv_nsec >> 8),1);
  }
  return 0;
}

Assistant:

bool poll() {
		const Metadata new_metadata = readFileMetadata(filename_.c_str());
		if (!new_metadata.valid())
			return false;

		if (new_metadata == metadata_)
			return false;

		if (!readFileContents(filename_.c_str(), buffer_))
			return false;

		MSG("Read file %s, %d bytes", filename_.c_str(), (int)buffer_.size());
		metadata_ = new_metadata;
		return true;
	}